

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O2

void handleLinkCOMOptions(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  ostream *poVar5;
  long lVar6;
  string linkComName;
  string comFrameName;
  Transform frame_H_link;
  Position linkComWrtFrame;
  Position linkComWrtLink;
  allocator<char> local_110 [32];
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [16];
  allocator<char> local_d0 [32];
  string local_b0 [3];
  Transform local_50 [48];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"link-com",local_110);
  bVar1 = cmdline::parser::exist(cmd,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"link-com",(allocator<char> *)&local_f0);
    pbVar3 = cmdline::parser::get<std::__cxx11::string>(cmd,local_b0);
    std::__cxx11::string::string((string *)local_110,(string *)pbVar3);
    std::__cxx11::string::~string((string *)local_b0);
    local_f0 = local_e0;
    local_e8 = 0;
    local_e0[0] = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"link-com-frame",local_d0)
    ;
    bVar1 = cmdline::parser::exist(cmd,local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b0,"link-com-frame",local_d0);
      cmdline::parser::get<std::__cxx11::string>(cmd,local_b0);
      std::__cxx11::string::_M_assign((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_f0);
    }
    iDynTree::KinDynComputations::getRelativeTransform((string *)local_b0,(string *)comp);
    psVar4 = (string *)iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getLinkIndex(psVar4);
    cVar2 = iDynTree::Model::isValidLinkIndex((long)psVar4);
    if (cVar2 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Link ");
      poVar5 = std::operator<<(poVar5,(string *)local_110);
      poVar5 = std::operator<<(poVar5," not found in the model");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    lVar6 = iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getLink(lVar6);
    iDynTree::Link::getInertia();
    iDynTree::SpatialInertia::getCenterOfMass();
    iDynTree::Transform::operator*(local_50,(Position *)local_b0);
    poVar5 = std::operator<<((ostream *)&std::cout,"The COM of link ");
    poVar5 = std::operator<<(poVar5,(string *)local_110);
    poVar5 = std::operator<<(poVar5," with respect to frame ");
    poVar5 = std::operator<<(poVar5,(string *)&local_f0);
    poVar5 = std::operator<<(poVar5," is ");
    iDynTree::Position::toString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)local_d0);
    poVar5 = std::operator<<(poVar5," m . ");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)local_110);
  }
  return;
}

Assistant:

void handleLinkCOMOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    using namespace iDynTree;

    if( !cmd.exist("link-com") )
    {
        return;
    }

    std::string linkComName = cmd.get<std::string>("link-com");

    std::string comFrameName;
    if( cmd.exist("link-com-frame") )
    {
        comFrameName = cmd.get<std::string>("link-com-frame");
    }
    else
    {
        comFrameName = linkComName;
    }

    Transform frame_H_link = comp.getRelativeTransform(comFrameName,linkComName);

    const Model & model = comp.getRobotModel();
    LinkIndex linkComIndex = model.getLinkIndex(linkComName);

    if( !model.isValidLinkIndex(linkComIndex) )
    {
        std::cerr << "Link " << linkComName << " not found in the model" <<  std::endl;
    }

    Position linkComWrtLink = comp.getRobotModel().getLink(linkComIndex)->getInertia().getCenterOfMass();

    Position linkComWrtFrame = frame_H_link*linkComWrtLink;

    std::cout << "The COM of link " << linkComName << " with respect to frame " << comFrameName
              << " is " << linkComWrtFrame.toString() << " m . " << std::endl;
}